

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

unique_ptr<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>_>
__thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::createExecutionQueue
          (BuildSystemFrontendDelegate *this)

{
  int iVar1;
  bool bVar2;
  QualityOfService *pQVar3;
  ExecutionQueue *pEVar4;
  long *in_RSI;
  QualityOfService local_154;
  Twine local_138;
  undefined8 local_120;
  undefined4 local_118;
  char *local_110;
  size_t local_108;
  int local_100;
  int local_fc;
  uint numCPUs;
  uint numLanes;
  undefined1 local_f0 [4];
  QualityOfService qos;
  BuildSystemInvocation invocation;
  BuildSystemFrontendDelegateImpl *impl;
  BuildSystemFrontendDelegate *this_local;
  
  invocation._184_8_ = in_RSI[6];
  BuildSystemInvocation::BuildSystemInvocation
            ((BuildSystemInvocation *)local_f0,
             *(BuildSystemInvocation **)(*(long *)(invocation._184_8_ + 0x30) + 0x10));
  bVar2 = llvm::Optional<llbuild::basic::QualityOfService>::hasValue
                    ((Optional<llbuild::basic::QualityOfService> *)&invocation.schedulerAlgorithm);
  if (bVar2) {
    pQVar3 = llvm::Optional<llbuild::basic::QualityOfService>::getValue
                       ((Optional<llbuild::basic::QualityOfService> *)&invocation.schedulerAlgorithm
                       );
    local_154 = *pQVar3;
  }
  else {
    local_154 = basic::getDefaultQualityOfService();
  }
  numLanes = local_154;
  if ((local_f0[3] & 1U) == 0) {
    local_fc = invocation.traceFilePath.field_2._12_4_;
    iVar1 = local_fc;
    if ((invocation.traceFilePath.field_2._12_4_ == 0) &&
       (local_100 = std::thread::hardware_concurrency(), iVar1 = local_100, local_100 == 0)) {
      local_110 = "<unknown>";
      local_108 = strlen("<unknown>");
      local_120 = 0;
      local_118 = 0;
      llvm::Twine::Twine(&local_138,"unable to detect number of CPUs");
      (**(code **)(*in_RSI + 0x18))(in_RSI,local_110,local_108,&local_120,&local_138);
      local_fc = 1;
      iVar1 = local_fc;
    }
    local_fc = iVar1;
    pEVar4 = basic::createLaneBasedExecutionQueue
                       ((ExecutionQueueDelegate *)(invocation._184_8_ + 0x20),local_fc,
                        invocation.traceFilePath.field_2._8_4_,numLanes,
                        (char **)invocation.qos.Storage);
    std::
    unique_ptr<llbuild::basic::ExecutionQueue,std::default_delete<llbuild::basic::ExecutionQueue>>::
    unique_ptr<std::default_delete<llbuild::basic::ExecutionQueue>,void>
              ((unique_ptr<llbuild::basic::ExecutionQueue,std::default_delete<llbuild::basic::ExecutionQueue>>
                *)this,pEVar4);
  }
  else {
    pEVar4 = basic::createLaneBasedExecutionQueue
                       ((ExecutionQueueDelegate *)(invocation._184_8_ + 0x20),1,
                        invocation.traceFilePath.field_2._8_4_,local_154,
                        (char **)invocation.qos.Storage);
    std::
    unique_ptr<llbuild::basic::ExecutionQueue,std::default_delete<llbuild::basic::ExecutionQueue>>::
    unique_ptr<std::default_delete<llbuild::basic::ExecutionQueue>,void>
              ((unique_ptr<llbuild::basic::ExecutionQueue,std::default_delete<llbuild::basic::ExecutionQueue>>
                *)this,pEVar4);
  }
  numCPUs = 1;
  BuildSystemInvocation::~BuildSystemInvocation((BuildSystemInvocation *)local_f0);
  return (__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
          )(__uniq_ptr_data<llbuild::basic::ExecutionQueue,_std::default_delete<llbuild::basic::ExecutionQueue>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExecutionQueue>
BuildSystemFrontendDelegate::createExecutionQueue() {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  auto invocation = impl->frontend->invocation;
  QualityOfService qos = invocation.qos.hasValue() ?
      invocation.qos.getValue() : getDefaultQualityOfService();
  
  if (invocation.useSerialBuild) {
    return std::unique_ptr<ExecutionQueue>(
        createLaneBasedExecutionQueue(impl->executionQueueDelegate, 1,
                                      invocation.schedulerAlgorithm, qos,
                                      invocation.environment));
  }
    
  // Get the number of CPUs to use.
  unsigned numLanes = invocation.schedulerLanes;
  if (numLanes == 0) {
    unsigned numCPUs = std::thread::hardware_concurrency();
    if (numCPUs == 0) {
      error("<unknown>", {}, "unable to detect number of CPUs");
      numLanes = 1;
    } else {
      numLanes = numCPUs;
    }
  }
    
  return std::unique_ptr<ExecutionQueue>(
      createLaneBasedExecutionQueue(impl->executionQueueDelegate, numLanes,
                                    invocation.schedulerAlgorithm, qos,
                                    invocation.environment));
}